

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

LogMessage * __thiscall
google::protobuf::internal::LogMessage::operator<<(LogMessage *this,StringPiece *value)

{
  char *pcVar1;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18;
  undefined7 uStack_17;
  
  pcVar1 = value->ptr_;
  if (pcVar1 == (char *)0x0) {
    local_28 = &local_18;
    local_20 = 0;
    local_18 = 0;
  }
  else {
    local_28 = &local_18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_28,pcVar1,pcVar1 + value->length_);
  }
  std::__cxx11::string::_M_append((char *)&this->message_,(ulong)local_28);
  if (local_28 != &local_18) {
    operator_delete(local_28,CONCAT71(uStack_17,local_18) + 1);
  }
  return this;
}

Assistant:

LogMessage& LogMessage::operator<<(const StringPiece& value) {
  message_ += value.ToString();
  return *this;
}